

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

Int128 __thiscall ClipperLib::Int128::operator*(Int128 *this,Int128 *rhs)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  long lVar5;
  ulong *in_RDX;
  ulong uVar6;
  ulong uVar7;
  Int128 *tmp;
  ulong uVar8;
  Int128 IVar9;
  
  uVar1 = rhs->hi;
  if ((1 < uVar1 + 1) || (uVar2 = *in_RDX, 1 < uVar2 + 1)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "Int128 operator*: overflow error";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  uVar7 = -rhs->lo;
  if (-1 < (long)uVar1) {
    uVar7 = rhs->lo;
  }
  uVar6 = in_RDX[1];
  this->hi = *in_RDX;
  this->lo = uVar6;
  uVar6 = -this->lo;
  if (-1 < this->hi) {
    uVar6 = this->lo;
  }
  uVar8 = (uVar6 & 0xffffffff) * (uVar7 & 0xffffffff);
  uVar4 = (uVar6 >> 0x20) * (uVar7 & 0xffffffff) + (uVar7 >> 0x20) * (uVar6 & 0xffffffff);
  uVar7 = (uVar4 >> 0x20) + (uVar6 >> 0x20) * (uVar7 >> 0x20);
  this->hi = uVar7;
  uVar4 = uVar4 << 0x20;
  lVar5 = uVar4 + uVar8;
  this->lo = lVar5;
  if (CARRY8(uVar4,uVar8)) {
    uVar7 = uVar7 + 1;
    this->hi = uVar7;
  }
  if ((long)(uVar2 ^ uVar1) < 0) {
    if (lVar5 == 0) {
      if (uVar7 == 0) goto LAB_0064145b;
      uVar7 = -uVar7;
    }
    else {
      this->lo = -lVar5;
      uVar7 = ~uVar7;
    }
    this->hi = uVar7;
  }
LAB_0064145b:
  IVar9.lo = uVar7;
  IVar9.hi = (long64)this;
  return IVar9;
}

Assistant:

Int128 operator * (const Int128 &rhs) const
    {
      if ( !(hi == 0 || hi == -1) || !(rhs.hi == 0 || rhs.hi == -1))
        throw "Int128 operator*: overflow error";
      bool negate = (hi < 0) != (rhs.hi < 0);

      Int128 tmp(*this);
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int1Hi = ulong64(tmp.lo) >> 32;
      ulong64 int1Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      tmp = rhs;
      if (tmp.hi < 0) Negate(tmp);
      ulong64 int2Hi = ulong64(tmp.lo) >> 32;
      ulong64 int2Lo = ulong64(tmp.lo & 0xFFFFFFFF);

      //nb: see comments in clipper.pas
      ulong64 a = int1Hi * int2Hi;
      ulong64 b = int1Lo * int2Lo;
      ulong64 c = int1Hi * int2Lo + int1Lo * int2Hi;

      tmp.hi = long64(a + (c >> 32));
      tmp.lo = long64(c << 32);
      tmp.lo += long64(b);
      if (ulong64(tmp.lo) < b) tmp.hi++;
      if (negate) Negate(tmp);
      return tmp;
    }